

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

void sysbvm_jit_caseJump(sysbvm_bytecodeJit_t *jit,int16_t valueOperand,size_t caseCount,
                        int16_t *caseKeyOperands,int16_t *caseLabelOperands,
                        int16_t defaultLabelOperand,size_t pc)

{
  int32_t iVar1;
  sysbvm_bytecodeJitPCRelocation_t relocation_00;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  sysbvm_bytecodeJitPCRelocation_t relocation;
  undefined8 local_58;
  long lStack_50;
  undefined8 local_48;
  int16_t *local_40;
  uint8_t local_38 [8];
  
  local_40 = caseLabelOperands;
  if (caseCount != 0) {
    sVar4 = 0;
    do {
      lVar2 = local_58;
      iVar1 = jit->contextPointerOffset;
      local_58._7_1_ = SUB81(lVar2,7);
      local_58._0_7_ =
           CONCAT16((char)((uint)iVar1 >> 0x18),
                    CONCAT15((char)((uint)iVar1 >> 0x10),
                             CONCAT14((char)((uint)iVar1 >> 8),CONCAT13((char)iVar1,0xbd8b48))));
      sysbvm_bytecodeJit_addBytes(jit,7,(uint8_t *)&local_58);
      sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,valueOperand);
      sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,caseKeyOperands[sVar4]);
      sysbvm_jit_x86_call(jit,sysbvm_tuple_equals);
      local_38[0] = 0x84;
      local_38[1] = 0xc0;
      local_38[2] = '\x0f';
      local_38[3] = 0x85;
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      sVar3 = sysbvm_bytecodeJit_addBytes(jit,8,local_38);
      local_58 = sVar3 - 4;
      lStack_50 = (long)local_40[sVar4] + pc;
      local_48 = 0xfffffffffffffffc;
      relocation_00.targetPC = lStack_50;
      relocation_00.offset = local_58;
      relocation_00.addend = -4;
      sysbvm_bytecodeJit_addPCRelocation(jit,relocation_00);
      sVar4 = sVar4 + 1;
    } while (caseCount != sVar4);
  }
  sysbvm_jit_jumpRelative(jit,(long)defaultLabelOperand + pc);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_caseJump(sysbvm_bytecodeJit_t *jit, int16_t valueOperand, size_t caseCount, int16_t *caseKeyOperands, int16_t *caseLabelOperands, int16_t defaultLabelOperand, size_t pc)
{
    for(size_t i = 0; i < caseCount; ++i)
    {
        sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, valueOperand);
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, caseKeyOperands[i]);
        sysbvm_jit_x86_call(jit, &sysbvm_tuple_equals);

        uint8_t instruction[] = {
            // test AL, AL
            0x84, sysbvm_jit_x86_modRMRegister(SYSBVM_X86_RAX, SYSBVM_X86_RAX),

            // jnz
            0x0F, 0x85, 0x00, 0x00, 0x00, 0x00,
        };

        size_t relocationOffset = sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction) - 4;
        sysbvm_bytecodeJitPCRelocation_t relocation = {
            .offset = relocationOffset,
            .targetPC = pc + caseLabelOperands[i],
            .addend = -4,
        };
        sysbvm_bytecodeJit_addPCRelocation(jit, relocation);
    }

    sysbvm_jit_jumpRelative(jit, pc + defaultLabelOperand);
}